

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

vector<char,_std::allocator<char>_> * wasm::read_stdin(void)

{
  bool bVar1;
  long *plVar2;
  vector<char,_std::allocator<char>_> *in_RDI;
  value_type local_21 [8];
  char c;
  
  bVar1 = isDebugEnabled("file");
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,"Loading stdin...\n");
  }
  (in_RDI->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (in_RDI->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (in_RDI->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  while( true ) {
    plVar2 = (long *)std::istream::get((char *)&std::cin);
    if (((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) ||
       (((byte)std::__cxx11::string::insert[*(long *)(std::cin + -0x18)] & 2) != 0)) break;
    std::vector<char,_std::allocator<char>_>::push_back(in_RDI,local_21);
  }
  return in_RDI;
}

Assistant:

std::vector<char> wasm::read_stdin() {
  BYN_TRACE("Loading stdin...\n");
  std::vector<char> input;
  char c;
  while (std::cin.get(c) && !std::cin.eof()) {
    input.push_back(c);
  }
  return input;
}